

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metablock.c
# Opt level: O2

void BrotliBuildMetaBlockGreedy
               (MemoryManager *m,uint8_t *ringbuffer,size_t pos,size_t mask,uint8_t prev_byte,
               uint8_t prev_byte2,ContextLut literal_context_lut,size_t num_contexts,
               uint32_t *static_context_map,Command_conflict *commands,size_t n_commands,
               BlockSplitFromDecoder *literals_block_splits,size_t *current_block_literals,
               BlockSplitFromDecoder *cmds_block_splits,size_t *current_block_cmds,
               MetaBlockSplit *mb)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  size_t __n;
  undefined1 auVar7 [16];
  Command_conflict *pCVar8;
  ulong uVar9;
  uint8_t *__dest;
  uint32_t *puVar10;
  HistogramLiteral *__s;
  size_t sVar11;
  ulong uVar12;
  size_t sVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  bool bVar17;
  undefined4 in_XMM0_Da;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 uVar18;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 in_XMM0_Db;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 uVar19;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  MemoryManager *pMVar20;
  size_t *psVar21;
  BlockSplitterCommand cmd_blocks;
  anon_union_336_2_32013c24 lit_blocks;
  BlockSplitterDistance dist_blocks;
  
  if (num_contexts == 1) {
    sVar13 = 0;
    pCVar8 = commands;
    sVar11 = n_commands;
    while (bVar17 = sVar11 != 0, sVar11 = sVar11 - 1, bVar17) {
      sVar13 = sVar13 + pCVar8->insert_len_;
      pCVar8 = pCVar8 + 1;
    }
    pMVar20 = m;
    InitBlockSplitterLiteral
              (m,&lit_blocks.plain,sVar13,(size_t)mb,(double)CONCAT44(in_XMM0_Db,in_XMM0_Da),
               (size_t)&mb->literal_histograms,(BlockSplit *)&mb->literal_histograms_size,
               (HistogramLiteral **)m,(size_t *)pos);
    uVar18 = extraout_XMM0_Da;
    uVar19 = extraout_XMM0_Db;
    if (literals_block_splits != (BlockSplitFromDecoder *)0x0) {
      lit_blocks.plain.num_types_ = 0;
      BrotliSplitBlockLiteralsFromStored
                (m,commands,n_commands,pos,mask,lit_blocks.plain.split_,literals_block_splits,
                 current_block_literals);
      uVar18 = extraout_XMM0_Da_00;
      uVar19 = extraout_XMM0_Db_00;
    }
    InitBlockSplitterCommand
              (m,&cmd_blocks,n_commands,(size_t)&mb->command_split,(double)CONCAT44(uVar19,uVar18),
               (size_t)&mb->command_histograms,(BlockSplit *)&mb->command_histograms_size,
               (HistogramCommand **)pMVar20,(size_t *)pos);
    InitBlockSplitterDistance
              (m,&dist_blocks,n_commands,(size_t)&mb->distance_split,
               (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01),
               (size_t)&mb->distance_histograms,(BlockSplit *)&mb->distance_histograms_size,
               (HistogramDistance **)pMVar20,(size_t *)pos);
    if (cmds_block_splits != (BlockSplitFromDecoder *)0x0) {
      cmd_blocks.num_types_ = 0;
      BrotliSplitBlockCommandsFromStored
                (m,commands,n_commands,pos,mask,cmd_blocks.split_,cmds_block_splits,
                 current_block_cmds);
    }
    for (sVar11 = 0; sVar11 != n_commands; sVar11 = sVar11 + 1) {
      uVar4 = commands[sVar11].insert_len_;
      uVar16 = commands[sVar11].copy_len_;
      uVar2 = commands[sVar11].cmd_prefix_;
      uVar3 = commands[sVar11].dist_prefix_;
      if (cmds_block_splits == (BlockSplitFromDecoder *)0x0) {
        BlockSplitterAddSymbolCommand(&cmd_blocks,(ulong)uVar2);
      }
      else {
        BlockSplitterStoredAddSymbolCommand(&cmd_blocks,(ulong)uVar2);
      }
      psVar21 = (size_t *)pos;
      for (lVar14 = 0; -lVar14 != (ulong)uVar4; lVar14 = lVar14 + -1) {
        if (literals_block_splits == (BlockSplitFromDecoder *)0x0) {
          BlockSplitterAddSymbolLiteral(&lit_blocks.plain,(ulong)ringbuffer[pos & mask]);
        }
        else {
          BlockSplitterStoredAddSymbolLiteral(&lit_blocks.plain,(ulong)ringbuffer[pos & mask]);
        }
        pos = pos + 1;
      }
      uVar16 = uVar16 & 0x1ffffff;
      if ((uVar16 != 0) && (0x7f < uVar2)) {
        BlockSplitterAddSymbolDistance(&dist_blocks,(ulong)(uVar3 & 0x3ff));
      }
      pos = (long)psVar21 + ((ulong)uVar16 - lVar14);
    }
    if (literals_block_splits == (BlockSplitFromDecoder *)0x0) {
      BlockSplitterFinishBlockLiteral(&lit_blocks.plain,1);
    }
    else {
      BlockSplitterStoredFinishBlockLiteral(&lit_blocks.plain,1);
    }
    if (cmds_block_splits == (BlockSplitFromDecoder *)0x0) {
      BlockSplitterFinishBlockCommand(&cmd_blocks,1);
    }
    else {
      BlockSplitterStoredFinishBlockCommand(&cmd_blocks,1);
    }
    BlockSplitterFinishBlockDistance(&dist_blocks,1);
  }
  else {
    uVar9 = 0;
    pCVar8 = commands;
    sVar11 = n_commands;
    while (bVar17 = sVar11 != 0, sVar11 = sVar11 - 1, bVar17) {
      uVar9 = uVar9 + pCVar8->insert_len_;
      pCVar8 = pCVar8 + 1;
    }
    uVar15 = 0x3ff;
    if (0x3ff < uVar9 >> 9) {
      uVar15 = uVar9 >> 9;
    }
    lit_blocks.plain.alphabet_size_ = 0x100;
    lit_blocks.plain.min_block_size_ = num_contexts;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = num_contexts;
    sVar11 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x100)) / auVar7,0);
    lit_blocks.plain.num_blocks_ = 0x200;
    lit_blocks.plain.num_types_ = 0x4079000000000000;
    lit_blocks.plain.split_ = (BlockSplit *)0x0;
    lit_blocks.ctx.histograms_size_ = &mb->literal_histograms_size;
    uVar9 = uVar15 + 1;
    lit_blocks.ctx.split_ = &mb->literal_split;
    lit_blocks.plain.curr_histogram_ix_ = 0x200;
    lit_blocks.ctx.merge_last_count_ = 0;
    lit_blocks.plain.last_histogram_ix_[0] = 0;
    lit_blocks.plain.last_histogram_ix_[1] = 0;
    uVar6 = (mb->literal_split).types_alloc_size;
    lit_blocks.ctx.max_block_types_ = sVar11;
    if (uVar6 <= uVar15) {
      if (uVar6 == 0) {
        uVar6 = uVar9;
      }
      do {
        uVar12 = uVar6;
        uVar6 = uVar12 * 2;
      } while (uVar12 <= uVar15);
      __dest = (uint8_t *)BrotliAllocate(m,uVar12);
      __n = (mb->literal_split).types_alloc_size;
      if (__n != 0) {
        memcpy(__dest,(mb->literal_split).types,__n);
      }
      BrotliFree(m,(mb->literal_split).types);
      (mb->literal_split).types = __dest;
      (mb->literal_split).types_alloc_size = uVar12;
    }
    uVar6 = (mb->literal_split).lengths_alloc_size;
    if (uVar6 <= uVar15) {
      if (uVar6 == 0) {
        uVar6 = uVar9;
      }
      do {
        uVar12 = uVar6;
        uVar6 = uVar12 * 2;
      } while (uVar12 <= uVar15);
      puVar10 = (uint32_t *)BrotliAllocate(m,uVar12 * 4);
      sVar13 = (mb->literal_split).lengths_alloc_size;
      if (sVar13 != 0) {
        memcpy(puVar10,(mb->literal_split).lengths,sVar13 << 2);
      }
      BrotliFree(m,(mb->literal_split).lengths);
      (mb->literal_split).lengths = puVar10;
      (mb->literal_split).lengths_alloc_size = uVar12;
    }
    (mb->literal_split).num_blocks = uVar9;
    sVar11 = (sVar11 + 1) * num_contexts;
    mb->literal_histograms_size = sVar11;
    if (sVar11 == 0) {
      __s = (HistogramLiteral *)0x0;
    }
    else {
      __s = (HistogramLiteral *)BrotliAllocate(m,sVar11 * 0x410);
    }
    mb->literal_histograms = __s;
    sVar11 = num_contexts;
    lit_blocks.ctx.histograms_ = __s;
    while (bVar17 = sVar11 != 0, sVar11 = sVar11 - 1, bVar17) {
      memset(__s,0,0x408);
      __s->bit_cost_ = INFINITY;
      __s = __s + 1;
    }
    uVar18 = 0;
    uVar19 = 0;
    lit_blocks.plain.last_entropy_[0] = 0.0;
    lit_blocks.plain.last_entropy_[1] = 0.0;
    pMVar20 = m;
    if (literals_block_splits != (BlockSplitFromDecoder *)0x0) {
      lit_blocks.plain.histograms_ = (HistogramLiteral *)0x0;
      BrotliSplitBlockLiteralsFromStored
                (m,commands,n_commands,pos,mask,lit_blocks.ctx.split_,literals_block_splits,
                 current_block_literals);
      uVar18 = extraout_XMM0_Da_02;
      uVar19 = extraout_XMM0_Db_02;
    }
    InitBlockSplitterCommand
              (m,&cmd_blocks,n_commands,(size_t)&mb->command_split,(double)CONCAT44(uVar19,uVar18),
               (size_t)&mb->command_histograms,(BlockSplit *)&mb->command_histograms_size,
               (HistogramCommand **)pMVar20,(size_t *)pos);
    InitBlockSplitterDistance
              (m,&dist_blocks,n_commands,(size_t)&mb->distance_split,
               (double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03),
               (size_t)&mb->distance_histograms,(BlockSplit *)&mb->distance_histograms_size,
               (HistogramDistance **)pMVar20,(size_t *)pos);
    if (cmds_block_splits != (BlockSplitFromDecoder *)0x0) {
      cmd_blocks.num_types_ = 0;
      BrotliSplitBlockCommandsFromStored
                (m,commands,n_commands,pos,mask,cmd_blocks.split_,cmds_block_splits,
                 current_block_cmds);
    }
    for (sVar11 = 0; sVar11 != n_commands; sVar11 = sVar11 + 1) {
      uVar4 = commands[sVar11].insert_len_;
      uVar16 = commands[sVar11].copy_len_;
      uVar2 = commands[sVar11].cmd_prefix_;
      uVar3 = commands[sVar11].dist_prefix_;
      if (cmds_block_splits == (BlockSplitFromDecoder *)0x0) {
        BlockSplitterAddSymbolCommand(&cmd_blocks,(ulong)uVar2);
      }
      else {
        BlockSplitterStoredAddSymbolCommand(&cmd_blocks,(ulong)uVar2);
      }
      bVar1 = prev_byte;
      for (uVar9 = 0; prev_byte = bVar1, uVar4 != uVar9; uVar9 = uVar9 + 1) {
        bVar1 = ringbuffer[pos + uVar9 & mask];
        uVar5 = static_context_map
                [literal_context_lut[(ulong)prev_byte2 + 0x100] | literal_context_lut[prev_byte]];
        lit_blocks.ctx.histograms_[lit_blocks.plain.last_histogram_ix_[1] + uVar5].data_[bVar1] =
             lit_blocks.ctx.histograms_[lit_blocks.plain.last_histogram_ix_[1] + uVar5].data_[bVar1]
             + 1;
        lit_blocks.ctx.histograms_[lit_blocks.plain.last_histogram_ix_[1] + uVar5].total_count_ =
             lit_blocks.ctx.histograms_[lit_blocks.plain.last_histogram_ix_[1] + uVar5].total_count_
             + 1;
        lit_blocks.plain.last_histogram_ix_[0] = lit_blocks.plain.last_histogram_ix_[0] + 1;
        if (literals_block_splits == (BlockSplitFromDecoder *)0x0) {
          if (lit_blocks.plain.last_histogram_ix_[0] == lit_blocks.plain.curr_histogram_ix_) {
            ContextBlockSplitterFinishBlock(&lit_blocks.ctx,pMVar20,0);
          }
        }
        else if (lit_blocks.plain.last_histogram_ix_[0] ==
                 (lit_blocks.ctx.split_)->lengths[lit_blocks.ctx.num_blocks_]) {
          ContextBlockSplitterStoredFinishBlockLiterals(&lit_blocks.ctx,pMVar20,0);
        }
        prev_byte2 = prev_byte;
      }
      uVar15 = (ulong)(uVar16 & 0x1ffffff);
      if ((uVar16 & 0x1ffffff) != 0) {
        prev_byte2 = ringbuffer[pos + uVar9 + uVar15 + -2 & mask];
        prev_byte = ringbuffer[pos + uVar9 + uVar15 + -1 & mask];
        if (0x7f < uVar2) {
          BlockSplitterAddSymbolDistance(&dist_blocks,(ulong)(uVar3 & 0x3ff));
        }
      }
      pos = pos + uVar9 + uVar15;
    }
    if (literals_block_splits == (BlockSplitFromDecoder *)0x0) {
      ContextBlockSplitterFinishBlock(&lit_blocks.ctx,pMVar20,1);
    }
    else {
      ContextBlockSplitterStoredFinishBlockLiterals(&lit_blocks.ctx,pMVar20,1);
    }
    if (cmds_block_splits == (BlockSplitFromDecoder *)0x0) {
      BlockSplitterFinishBlockCommand(&cmd_blocks,1);
    }
    else {
      BlockSplitterStoredFinishBlockCommand(&cmd_blocks,1);
    }
    BlockSplitterFinishBlockDistance(&dist_blocks,1);
    sVar11 = (mb->literal_split).num_types;
    mb->literal_context_map_size = sVar11 << 6;
    if (sVar11 << 6 == 0) {
      puVar10 = (uint32_t *)0x0;
    }
    else {
      puVar10 = (uint32_t *)BrotliAllocate(pMVar20,sVar11 << 8);
      sVar11 = (mb->literal_split).num_types;
    }
    mb->literal_context_map = puVar10;
    for (sVar13 = 0; sVar13 != sVar11; sVar13 = sVar13 + 1) {
      for (lVar14 = 0; lVar14 != 0x40; lVar14 = lVar14 + 1) {
        puVar10[lVar14] = static_context_map[lVar14] + (int)sVar13 * (int)num_contexts;
      }
      puVar10 = puVar10 + 0x40;
    }
  }
  return;
}

Assistant:

void BrotliBuildMetaBlockGreedy(MemoryManager* m,
                                const uint8_t* ringbuffer,
                                size_t pos,
                                size_t mask,
                                uint8_t prev_byte,
                                uint8_t prev_byte2,
                                ContextLut literal_context_lut,
                                size_t num_contexts,
                                const uint32_t* static_context_map,
                                const Command* commands,
                                size_t n_commands,
                                const BlockSplitFromDecoder* literals_block_splits,
                                size_t* current_block_literals,
                                const BlockSplitFromDecoder* cmds_block_splits,
                                size_t* current_block_cmds,
                                MetaBlockSplit* mb) {
  if (num_contexts == 1) {
    BrotliBuildMetaBlockGreedyInternal(m, ringbuffer, pos, mask, prev_byte,
        prev_byte2, literal_context_lut, 1, NULL, commands, n_commands,
        literals_block_splits, current_block_literals,
        cmds_block_splits, current_block_cmds, mb);
  } else {
    BrotliBuildMetaBlockGreedyInternal(m, ringbuffer, pos, mask, prev_byte,
        prev_byte2, literal_context_lut, num_contexts, static_context_map,
        commands, n_commands, literals_block_splits, current_block_literals,
        cmds_block_splits, current_block_cmds, mb);
  }
}